

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

N_Vector N_VClone_Serial(N_Vector w)

{
  void *pvVar1;
  N_Vector p_Var2;
  void *pvVar3;
  
  p_Var2 = N_VCloneEmpty_Serial(w);
  if (0 < *w->content) {
    pvVar3 = malloc(*w->content << 3);
    pvVar1 = p_Var2->content;
    *(undefined4 *)((long)pvVar1 + 8) = 1;
    *(void **)((long)pvVar1 + 0x10) = pvVar3;
  }
  return p_Var2;
}

Assistant:

N_Vector N_VClone_Serial(N_Vector w)
{
  SUNFunctionBegin(w->sunctx);
  N_Vector v;
  sunrealtype* data;
  sunindextype length;

  v = NULL;
  v = N_VCloneEmpty_Serial(w);
  SUNCheckLastErrNull();

  length = NV_LENGTH_S(w);

  /* Create data */
  data = NULL;
  if (length > 0)
  {
    data = (sunrealtype*)malloc(length * sizeof(sunrealtype));
    SUNAssertNull(data, SUN_ERR_MALLOC_FAIL);

    /* Attach data */
    NV_OWN_DATA_S(v) = SUNTRUE;
    NV_DATA_S(v)     = data;
  }

  return (v);
}